

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O1

SUNErrCode SUNMatHermitianTransposeVec_Sparse(SUNMatrix A,N_Vector x,N_Vector y)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  void *pvVar10;
  long lVar11;
  long lVar12;
  sunrealtype *xd;
  sunindextype *Aj;
  sunindextype *Ap;
  sunrealtype *Ax;
  sunrealtype *yd;
  double dVar13;
  
  pvVar10 = A->content;
  iVar1 = *(int *)((long)pvVar10 + 0x28);
  lVar2 = *(long *)((long)pvVar10 + 0x38);
  lVar3 = *(long *)((long)pvVar10 + 0x20);
  lVar4 = *(long *)((long)pvVar10 + 0x30);
  lVar9 = N_VGetArrayPointer(x);
  pvVar10 = (void *)N_VGetArrayPointer(y);
  plVar5 = (long *)A->content;
  lVar6 = plVar5[1];
  if (iVar1 == 0) {
    if (0 < lVar6) {
      lVar11 = 0;
      memset(pvVar10,0,lVar6 * 8);
      do {
        lVar12 = *(long *)(lVar2 + lVar11 * 8);
        lVar7 = *(long *)(lVar2 + 8 + lVar11 * 8);
        if (lVar12 < lVar7) {
          dVar13 = *(double *)((long)pvVar10 + lVar11 * 8);
          do {
            dVar13 = dVar13 + *(double *)(lVar3 + lVar12 * 8) *
                              *(double *)(lVar9 + *(long *)(lVar4 + lVar12 * 8) * 8);
            *(double *)((long)pvVar10 + lVar11 * 8) = dVar13;
            lVar12 = lVar12 + 1;
          } while (lVar7 != lVar12);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != lVar6);
    }
  }
  else {
    if (0 < lVar6) {
      memset(pvVar10,0,lVar6 << 3);
    }
    lVar6 = *plVar5;
    if (0 < lVar6) {
      lVar11 = 0;
      do {
        lVar12 = *(long *)(lVar2 + lVar11 * 8);
        lVar7 = *(long *)(lVar2 + 8 + lVar11 * 8);
        if (lVar12 < lVar7) {
          do {
            lVar8 = *(long *)(lVar4 + lVar12 * 8);
            *(double *)((long)pvVar10 + lVar8 * 8) =
                 *(double *)(lVar3 + lVar12 * 8) * *(double *)(lVar9 + lVar11 * 8) +
                 *(double *)((long)pvVar10 + lVar8 * 8);
            lVar12 = lVar12 + 1;
          } while (lVar7 != lVar12);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != lVar6);
    }
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatHermitianTransposeVec_Sparse(SUNMatrix A, N_Vector x, N_Vector y)
{
  SUNFunctionBegin(A->sunctx);
  SUNAssert(SUNMatGetID(A) == SUNMATRIX_SPARSE, SUN_ERR_ARG_WRONGTYPE);
  SUNCheck(compatibleMatrixAndVectors(A, y, x), SUN_ERR_ARG_DIMSMISMATCH);

  /* Perform operation */
  if (SM_SPARSETYPE_S(A) == CSC_MAT)
  {
    SUNCheckCall(MatTransposeVec_SparseCSC(A, x, y));
  }
  else { SUNCheckCall(MatTransposeVec_SparseCSR(A, x, y)); }

  return SUN_SUCCESS;
}